

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_decode_server_name(char **name,uint8_t *src,uint8_t *end)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  void *pvVar3;
  char *pcVar4;
  uint8_t *puVar5;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t type;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  char **name_local;
  
  _capacity._4_4_ = 0;
  _block_size = 2;
  if ((ulong)((long)end - (long)src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    end_1 = (uint8_t *)0x0;
    end_local = src;
    do {
      puVar5 = end_local + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end_local);
      _block_size = _block_size - 1;
      end_local = puVar5;
    } while (_block_size != 0);
    if (end + -(long)puVar5 < end_1) {
      _capacity._4_4_ = 0x32;
    }
    else {
      puVar2 = puVar5 + (long)end_1;
      if (puVar5 == puVar2) {
        _capacity._4_4_ = 0x32;
      }
      else {
        do {
          uVar1 = *end_local;
          _block_size_1 = 2;
          if ((ulong)((long)puVar2 - (long)(end_local + 1)) < 2) {
            return 0x32;
          }
          end_2 = (uint8_t *)0x0;
          end_local = end_local + 1;
          do {
            puVar5 = end_local + 1;
            end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end_local);
            _block_size_1 = _block_size_1 - 1;
            end_local = puVar5;
          } while (_block_size_1 != 0);
          if (puVar2 + -(long)puVar5 < end_2) {
            return 0x32;
          }
          end_local = puVar5 + (long)end_2;
          if (uVar1 == '\0') {
            pvVar3 = memchr(puVar5,0,(long)end_local - (long)puVar5);
            if (pvVar3 != (void *)0x0) {
              return 0x2f;
            }
            if (*name != (char *)0x0) {
              return 0x2f;
            }
            pcVar4 = (char *)malloc((size_t)(end_local + (1 - (long)puVar5)));
            *name = pcVar4;
            if (pcVar4 == (char *)0x0) {
              return 0x201;
            }
            memcpy(*name,puVar5,(long)end_local - (long)puVar5);
            (*name)[(long)end_local - (long)puVar5] = '\0';
          }
        } while (end_local != puVar2);
        if (end_local == puVar2) {
          if (end_local != end) {
            _capacity._4_4_ = 0x32;
          }
        }
        else {
          _capacity._4_4_ = 0x32;
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int client_hello_decode_server_name(char **name, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *src++;
            decode_open_block(src, end, 2, {
                if (type == 0) {
                    if (memchr(src, '\0', end - src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    if (*name != NULL) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    if ((*name = malloc(end - src + 1)) == NULL) {
                        ret = PTLS_ERROR_NO_MEMORY;
                        goto Exit;
                    }
                    memcpy(*name, src, end - src);
                    (*name)[end - src] = '\0';
                }
                src = end;
            });
        } while (src != end);
    });

Exit:
    return ret;
}